

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64
drwav_read_pcm_frames_s32(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  drwav_int32 *pdVar13;
  undefined8 *puVar14;
  drwav_int32 dVar15;
  ulong uVar16;
  drwav_uint64 dVar17;
  drwav_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    dVar17 = 0;
  }
  else {
    if (pBufferOut == (drwav_int32 *)0x0) {
      dVar17 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
      return dVar17;
    }
    dVar17 = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      uVar1 = pWav->bitsPerSample;
      if (uVar1 == 0x20) {
        dVar17 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      }
      else {
        if ((uVar1 & 7) == 0) {
          uVar6 = (uint)(pWav->fmt).channels * (uint)uVar1 >> 3;
        }
        else {
          uVar6 = (uint)(pWav->fmt).blockAlign;
        }
        dVar3 = 0;
        dVar17 = 0;
        if (uVar6 != 0) {
          do {
            uVar5 = 0x1000 / (ulong)uVar6;
            if (framesToRead < 0x1000 / (ulong)uVar6) {
              uVar5 = framesToRead;
            }
            dVar17 = drwav_read_pcm_frames_le(pWav,uVar5,&local_1038);
            if (dVar17 == 0) {
              return dVar3;
            }
            uVar1 = pWav->channels;
            uVar12 = dVar17 * uVar1;
            uVar5 = (ulong)uVar6 / (ulong)uVar1;
            uVar2 = (uint)uVar5;
            switch(uVar2) {
            case 1:
              if (uVar12 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                lVar8 = 0;
                do {
                  pBufferOut[lVar8] = (*(byte *)((long)&local_1038 + lVar8) ^ 0xffffff80) << 0x18;
                  lVar8 = lVar8 + 1;
                } while (uVar12 - lVar8 != 0);
              }
              break;
            case 2:
              if (uVar12 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                lVar8 = 0;
                do {
                  pBufferOut[lVar8] = (uint)*(ushort *)((long)&local_1038 + lVar8 * 2) << 0x10;
                  lVar8 = lVar8 + 1;
                } while (uVar12 - lVar8 != 0);
              }
              break;
            case 3:
              if (uVar12 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                pbVar4 = (byte *)((long)&local_1038 + 2);
                lVar8 = 0;
                do {
                  pBufferOut[lVar8] = (uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8;
                  lVar8 = lVar8 + 1;
                  pbVar4 = pbVar4 + 3;
                } while (uVar12 - lVar8 != 0);
              }
              break;
            case 4:
              if (uVar12 == 0) {
LAB_00120919:
                uVar12 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  pBufferOut[uVar5] = *(drwav_int32 *)((long)&local_1038 + uVar5 * 4);
                  uVar5 = uVar5 + 1;
                } while ((uVar5 & 0xffffffff) <= uVar12 && uVar12 - (uVar5 & 0xffffffff) != 0);
              }
              break;
            default:
              if (uVar2 < 9) {
                if (uVar12 == 0) goto LAB_00120919;
                uVar11 = 0;
                puVar14 = &local_1038;
                pdVar13 = pBufferOut;
                do {
                  if (uVar6 < uVar1) {
                    dVar15 = 0;
                    uVar9 = 0;
                  }
                  else {
                    uVar9 = 0;
                    uVar16 = 0;
                    iVar7 = uVar2 * -8 + 0x40;
                    do {
                      uVar16 = uVar16 | (ulong)*(byte *)((long)puVar14 + uVar9) <<
                                        ((byte)iVar7 & 0x3f);
                      iVar7 = iVar7 + 8;
                      uVar9 = uVar9 + 1;
                    } while (uVar5 != uVar9);
                    dVar15 = (drwav_int32)(uVar16 >> 0x20);
                    uVar9 = uVar5;
                  }
                  puVar14 = (undefined8 *)((long)puVar14 + uVar9);
                  *pdVar13 = dVar15;
                  pdVar13 = pdVar13 + 1;
                  uVar11 = (ulong)((int)uVar11 + 1);
                } while (uVar11 <= uVar12 && uVar12 - uVar11 != 0);
              }
              else {
                memset(pBufferOut,0,uVar12 * 4);
                uVar12 = pWav->channels * dVar17;
              }
            }
            pBufferOut = pBufferOut + uVar12;
            dVar3 = dVar3 + dVar17;
            framesToRead = framesToRead - dVar17;
            dVar17 = dVar3;
          } while (framesToRead != 0);
        }
      }
      break;
    case 2:
      uVar5 = (ulong)pWav->channels;
      dVar17 = 0;
      do {
        uVar5 = (ulong)(ushort)(0x800 / (ushort)uVar5);
        if (framesToRead < uVar5) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_s16(pWav,uVar5,(drwav_int16 *)&local_1038);
        if (dVar3 == 0) {
          return dVar17;
        }
        uVar5 = (ulong)pWav->channels;
        lVar8 = dVar3 * uVar5;
        if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
          lVar10 = 0;
          do {
            pBufferOut[lVar10] = (uint)*(ushort *)((long)&local_1038 + lVar10 * 2) << 0x10;
            lVar10 = lVar10 + 1;
          } while (lVar8 - lVar10 != 0);
        }
        pBufferOut = pBufferOut + lVar8;
        dVar17 = dVar17 + dVar3;
        framesToRead = framesToRead - dVar3;
      } while (framesToRead != 0);
      break;
    case 3:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar6 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar6 = (uint)(pWav->fmt).blockAlign;
      }
      dVar3 = 0;
      dVar17 = 0;
      if (uVar6 != 0) {
        do {
          uVar5 = 0x1000 / (ulong)uVar6;
          if (framesToRead < 0x1000 / (ulong)uVar6) {
            uVar5 = framesToRead;
          }
          dVar17 = drwav_read_pcm_frames_le(pWav,uVar5,&local_1038);
          if (dVar17 == 0) {
            return dVar3;
          }
          lVar8 = dVar17 * pWav->channels;
          uVar2 = uVar6 / pWav->channels;
          if (uVar2 == 8) {
            if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
              lVar10 = 0;
              do {
                pBufferOut[lVar10] = (int)((double)(&local_1038)[lVar10] * 2147483648.0);
                lVar10 = lVar10 + 1;
              } while (lVar8 - lVar10 != 0);
            }
          }
          else if (uVar2 == 4) {
            if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
              lVar10 = 0;
              do {
                pBufferOut[lVar10] =
                     (int)(*(float *)((long)&local_1038 + lVar10 * 4) * 2.1474836e+09);
                lVar10 = lVar10 + 1;
              } while (lVar8 - lVar10 != 0);
            }
          }
          else {
            memset(pBufferOut,0,lVar8 * 4);
            lVar8 = pWav->channels * dVar17;
          }
          pBufferOut = pBufferOut + lVar8;
          dVar3 = dVar3 + dVar17;
          framesToRead = framesToRead - dVar17;
          dVar17 = dVar3;
        } while (framesToRead != 0);
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar6 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar6 = (uint)(pWav->fmt).blockAlign;
      }
      dVar3 = 0;
      dVar17 = 0;
      if (uVar6 != 0) {
        do {
          uVar5 = 0x1000 / (ulong)uVar6;
          if (framesToRead < 0x1000 / (ulong)uVar6) {
            uVar5 = framesToRead;
          }
          dVar17 = drwav_read_pcm_frames_le(pWav,uVar5,&local_1038);
          if (dVar17 == 0) {
            return dVar3;
          }
          lVar8 = pWav->channels * dVar17;
          if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
            lVar10 = 0;
            do {
              pBufferOut[lVar10] =
                   (uint)g_drwavAlawTable[*(byte *)((long)&local_1038 + lVar10)] << 0x10;
              lVar10 = lVar10 + 1;
            } while (lVar8 - lVar10 != 0);
          }
          pBufferOut = pBufferOut + lVar8;
          dVar3 = dVar3 + dVar17;
          framesToRead = framesToRead - dVar17;
          dVar17 = dVar3;
        } while (framesToRead != 0);
      }
      break;
    case 7:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar6 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar6 = (uint)(pWav->fmt).blockAlign;
      }
      dVar17 = 0;
      if (uVar6 != 0) {
        do {
          uVar5 = 0x1000 / (ulong)uVar6;
          if (framesToRead < 0x1000 / (ulong)uVar6) {
            uVar5 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,&local_1038);
          if (dVar3 == 0) {
            return dVar17;
          }
          lVar8 = pWav->channels * dVar3;
          if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
            lVar10 = 0;
            do {
              pBufferOut[lVar10] =
                   (uint)g_drwavMulawTable[*(byte *)((long)&local_1038 + lVar10)] << 0x10;
              lVar10 = lVar10 + 1;
            } while (lVar8 - lVar10 != 0);
          }
          pBufferOut = pBufferOut + lVar8;
          dVar17 = dVar17 + dVar3;
          framesToRead = framesToRead - dVar3;
        } while (framesToRead != 0);
      }
      break;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        uVar5 = (ulong)pWav->channels;
        dVar17 = 0;
        do {
          uVar5 = (ulong)(ushort)(0x800 / (ushort)uVar5);
          if (framesToRead < uVar5) {
            uVar5 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_s16(pWav,uVar5,(drwav_int16 *)&local_1038);
          if (dVar3 == 0) {
            return dVar17;
          }
          uVar5 = (ulong)pWav->channels;
          lVar8 = dVar3 * uVar5;
          if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
            lVar10 = 0;
            do {
              pBufferOut[lVar10] = (uint)*(ushort *)((long)&local_1038 + lVar10 * 2) << 0x10;
              lVar10 = lVar10 + 1;
            } while (lVar8 - lVar10 != 0);
          }
          pBufferOut = pBufferOut + lVar8;
          dVar17 = dVar17 + dVar3;
          framesToRead = framesToRead - dVar3;
        } while (framesToRead != 0);
      }
    }
  }
  return dVar17;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int32) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int32) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}